

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib512.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      uVar4 = 4;
    }
    else {
      curl_easy_setopt(lVar2,0x29,1);
      curl_easy_setopt(lVar2,0x2a,1);
      lVar3 = curl_easy_duphandle(lVar2);
      if (lVar3 == 0) {
        uVar4 = 3;
      }
      else {
        iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
        if (iVar1 == 0) {
          iVar1 = curl_easy_perform(lVar3);
          uVar4 = (uint)(iVar1 != 0);
        }
        else {
          uVar4 = 2;
        }
        curl_easy_cleanup(lVar3);
      }
      curl_easy_cleanup(lVar2);
    }
    curl_global_cleanup();
  }
  else {
    uVar4 = 5;
  }
  return uVar4;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  int rc = 99;

  code = curl_global_init(CURL_GLOBAL_ALL);
  if(code == CURLE_OK) {
    CURL *curl = curl_easy_init();
    if(curl) {
      CURL *curl2;

      curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
      curl_easy_setopt(curl, CURLOPT_HEADER, 1L);

      curl2 = curl_easy_duphandle(curl);
      if(curl2) {

        code = curl_easy_setopt(curl2, CURLOPT_URL, URL);
        if(code == CURLE_OK) {

          code = curl_easy_perform(curl2);
          if(code == CURLE_OK)
            rc = 0;
          else
            rc = 1;
        }
        else
          rc = 2;

        curl_easy_cleanup(curl2);
      }
      else
        rc = 3;

      curl_easy_cleanup(curl);
    }
    else
      rc = 4;

    curl_global_cleanup();
  }
  else
    rc = 5;

  return rc;
}